

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr type)

{
  SourceFile *pSVar1;
  StructSchema SVar2;
  StringPtr name;
  Fault f;
  Fault local_58;
  Schema local_50;
  char local_48;
  RawBrandedSchema *pRStack_40;
  ArrayDisposer *local_38;
  uint local_28;
  
  pSVar1 = (this->sourceFiles).builder.ptr;
  if ((long)(this->sourceFiles).builder.pos - (long)pSVar1 != 0x20) {
    local_58.exception = (Exception *)0x0;
    _local_48 = (_func_int **)0x0;
    pRStack_40 = (RawBrandedSchema *)0x0;
    kj::_::Debug::Fault::init
              (&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal(&local_58);
  }
  name.content.size_ = (size_t)type.content.ptr;
  name.content.ptr = (char *)pSVar1->id;
  resolveName((CompilerMain *)&stack0xffffffffffffffb8,(uint64_t)this,name);
  local_58.exception._0_1_ = local_48;
  if (local_48 == '\x01') {
    local_50.raw = pRStack_40;
  }
  if (local_48 == '\0') {
    kj::heapString((String *)&stack0xffffffffffffffb8,"no such type",0xc);
  }
  else {
    Schema::getProto((Reader *)&stack0xffffffffffffffb8,&local_50);
    if ((0x6f < local_28) && (*(short *)((long)&local_38[1]._vptr_ArrayDisposer + 4) == 1)) {
      SVar2 = Schema::asStruct(&local_50);
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar2.super_Schema.raw;
      (__return_storage_ptr__->errorMessage).ptr.isSet = false;
      return __return_storage_ptr__;
    }
    kj::heapString((String *)&stack0xffffffffffffffb8,"not a struct type",0x11);
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  *(_func_int ***)&(__return_storage_ptr__->errorMessage).ptr.field_1 = _local_48;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = (size_t)pRStack_40;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_38;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr type) {
    KJ_ASSERT(sourceFiles.size() == 1);

    KJ_IF_MAYBE(schema, resolveName(sourceFiles[0].id, type)) {
      if (schema->getProto().which() != schema::Node::STRUCT) {
        return "not a struct type";
      }
      rootType = schema->asStruct();
      return true;
    } else {
      return "no such type";
    }
  }